

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn.c
# Opt level: O3

int pt_insn_changes_cr3(pt_insn *insn,pt_insn_ext *iext)

{
  uint uVar1;
  
  uVar1 = 0;
  if (iext != (pt_insn_ext *)0x0) {
    uVar1 = (uint)(iext->iclass == PTI_INST_MOV_CR3);
  }
  return uVar1;
}

Assistant:

int pt_insn_changes_cr3(const struct pt_insn *insn,
			const struct pt_insn_ext *iext)
{
	(void) insn;

	if (!iext)
		return 0;

	switch (iext->iclass) {
	default:
		return 0;

	case PTI_INST_MOV_CR3:
		return 1;
	}
}